

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lebedev_laikov.hpp
# Opt level: O3

tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
* IntegratorXX::quadrature_traits<IntegratorXX::LebedevLaikov<double>,_void>::generate
            (tuple<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>,_std::vector<double,_std::allocator<double>_>_>
             *__return_storage_ptr__,size_t npts)

{
  int i;
  long lVar1;
  size_t sVar2;
  size_t __n;
  array<double,_26UL> *__src;
  array<double,_14UL> *paVar3;
  pointer pdVar4;
  byte bVar5;
  weight_container weights;
  point_container points;
  vector<double,_std::allocator<double>_> local_48;
  vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> local_30;
  allocator_type local_11;
  
  bVar5 = 0;
  std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::vector
            (&local_30,npts,(allocator_type *)&local_48);
  std::vector<double,_std::allocator<double>_>::vector(&local_48,npts,&local_11);
  if ((long)npts < 0x1b2) {
    if (0x6d < (long)npts) {
      if ((long)npts < 0xe6) {
        if ((long)npts < 0xaa) {
          if (npts == 0x6e) {
            memcpy(local_30.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   &LebedevLaikovGrids::lebedev_laikov_110<double>::points,0xa50);
            __n = 0x370;
            __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_110<double>::weights;
          }
          else {
            if (npts != 0x92) goto LAB_00119f04;
            memcpy(local_30.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   &LebedevLaikovGrids::lebedev_laikov_146<double>::points,0xdb0);
            __n = 0x490;
            __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_146<double>::weights;
          }
        }
        else if (npts == 0xaa) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &LebedevLaikovGrids::lebedev_laikov_170<double>::points,0xff0);
          __n = 0x550;
          __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_170<double>::weights;
        }
        else {
          if (npts != 0xc2) goto LAB_00119f04;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &LebedevLaikovGrids::lebedev_laikov_194<double>::points,0x1230);
          __n = 0x610;
          __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_194<double>::weights;
        }
      }
      else if ((long)npts < 0x12e) {
        if (npts == 0xe6) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &LebedevLaikovGrids::lebedev_laikov_230<double>::points,0x1590);
          __n = 0x730;
          __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_230<double>::weights;
        }
        else {
          if (npts != 0x10a) goto LAB_00119f04;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &LebedevLaikovGrids::lebedev_laikov_266<double>::points,0x18f0);
          __n = 0x850;
          __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_266<double>::weights;
        }
      }
      else if (npts == 0x12e) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &LebedevLaikovGrids::lebedev_laikov_302<double>::points,0x1c50);
        __n = 0x970;
        __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_302<double>::weights;
      }
      else {
        if (npts != 0x15e) goto LAB_00119f04;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &LebedevLaikovGrids::lebedev_laikov_350<double>::points,0x20d0);
        __n = 0xaf0;
        __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_350<double>::weights;
      }
      goto LAB_00119eff;
    }
    if (0x25 < (long)npts) {
      if ((long)npts < 0x4a) {
        if (npts == 0x26) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &LebedevLaikovGrids::lebedev_laikov_38<double>::points,0x390);
          __n = 0x130;
          __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_38<double>::weights;
        }
        else {
          if (npts != 0x32) goto LAB_00119f04;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &LebedevLaikovGrids::lebedev_laikov_50<double>::points,0x4b0);
          __n = 400;
          __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_50<double>::weights;
        }
      }
      else if (npts == 0x4a) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &LebedevLaikovGrids::lebedev_laikov_74<double>::points,0x6f0);
        __n = 0x250;
        __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_74<double>::weights;
      }
      else {
        if (npts != 0x56) goto LAB_00119f04;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &LebedevLaikovGrids::lebedev_laikov_86<double>::points,0x810);
        __n = 0x2b0;
        __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_86<double>::weights;
      }
      goto LAB_00119eff;
    }
    if ((long)npts < 0xe) {
      if (npts == 0) goto LAB_00119f28;
      if (npts == 6) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &LebedevLaikovGrids::lebedev_laikov_6<double>::points,0x90);
        *local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start = 0.1666666666666667;
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[1] = 0.1666666666666667;
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[2] = 0.1666666666666667;
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[3] = 0.1666666666666667;
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[4] = 0.1666666666666667;
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[5] = 0.1666666666666667;
      }
    }
    else if (npts == 0xe) {
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &LebedevLaikovGrids::lebedev_laikov_14<double>::points,0x150);
      paVar3 = &LebedevLaikovGrids::lebedev_laikov_14<double>::weights;
      pdVar4 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar1 = 0xe; lVar1 != 0; lVar1 = lVar1 + -1) {
        *pdVar4 = paVar3->_M_elems[0];
        paVar3 = (array<double,_14UL> *)((long)paVar3 + ((ulong)bVar5 * -2 + 1) * 8);
        pdVar4 = pdVar4 + (ulong)bVar5 * -2 + 1;
      }
    }
    else if (npts == 0x1a) {
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &LebedevLaikovGrids::lebedev_laikov_26<double>::points,0x270);
      __src = &LebedevLaikovGrids::lebedev_laikov_26<double>::weights;
      __n = 0xd0;
      goto LAB_00119eff;
    }
  }
  else {
    if ((long)npts < 0x932) {
      if ((long)npts < 0x4b2) {
        if ((long)npts < 0x302) {
          if (npts == 0x1b2) {
            memcpy(local_30.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   &LebedevLaikovGrids::lebedev_laikov_434<double>::points,0x28b0);
            __n = 0xd90;
            __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_434<double>::weights;
          }
          else {
            if (npts != 0x24e) goto LAB_00119f04;
            memcpy(local_30.
                   super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   &LebedevLaikovGrids::lebedev_laikov_590<double>::points,0x3750);
            __n = 0x1270;
            __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_590<double>::weights;
          }
        }
        else if (npts == 0x302) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &LebedevLaikovGrids::lebedev_laikov_770<double>::points,0x4830);
          __n = 0x1810;
          __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_770<double>::weights;
        }
        else {
          if (npts != 0x3ce) goto LAB_00119f04;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &LebedevLaikovGrids::lebedev_laikov_974<double>::points,0x5b50);
          __n = 0x1e70;
          __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_974<double>::weights;
        }
      }
      else if ((long)npts < 0x6c2) {
        if (npts == 0x4b2) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &LebedevLaikovGrids::lebedev_laikov_1202<double>::points,0x70b0);
          __n = 0x2590;
          __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_1202<double>::weights;
        }
        else {
          if (npts != 0x5ae) goto LAB_00119f04;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &LebedevLaikovGrids::lebedev_laikov_1454<double>::points,0x8850);
          __n = 0x2d70;
          __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_1454<double>::weights;
        }
      }
      else if (npts == 0x6c2) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &LebedevLaikovGrids::lebedev_laikov_1730<double>::points,0xa230);
        __n = 0x3610;
        __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_1730<double>::weights;
      }
      else {
        if (npts != 0x7ee) goto LAB_00119f04;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &LebedevLaikovGrids::lebedev_laikov_2030<double>::points,0xbe50);
        __n = 0x3f70;
        __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_2030<double>::weights;
      }
    }
    else if ((long)npts < 0xf32) {
      if ((long)npts < 0xc02) {
        if (npts == 0x932) {
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &LebedevLaikovGrids::lebedev_laikov_2354<double>::points,0xdcb0);
          __n = 0x4990;
          __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_2354<double>::weights;
        }
        else {
          if (npts != 0xa8e) goto LAB_00119f04;
          memcpy(local_30.
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 &LebedevLaikovGrids::lebedev_laikov_2702<double>::points,0xfd50);
          __n = 0x5470;
          __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_2702<double>::weights;
        }
      }
      else if (npts == 0xc02) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &LebedevLaikovGrids::lebedev_laikov_3074<double>::points,0x12030);
        __n = 0x6010;
        __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_3074<double>::weights;
      }
      else {
        if (npts != 0xd8e) goto LAB_00119f04;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &LebedevLaikovGrids::lebedev_laikov_3470<double>::points,0x14550);
        __n = 0x6c70;
        __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_3470<double>::weights;
      }
    }
    else if ((long)npts < 0x12c2) {
      if (npts == 0xf32) {
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &LebedevLaikovGrids::lebedev_laikov_3890<double>::points,0x16cb0);
        __n = 0x7990;
        __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_3890<double>::weights;
      }
      else {
        if (npts != 0x10ee) goto LAB_00119f04;
        memcpy(local_30.
               super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               &LebedevLaikovGrids::lebedev_laikov_4334<double>::points,0x19650);
        __n = 0x8770;
        __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_4334<double>::weights;
      }
    }
    else if (npts == 0x12c2) {
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &LebedevLaikovGrids::lebedev_laikov_4802<double>::points,0x1c230);
      __n = 0x9610;
      __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_4802<double>::weights;
    }
    else {
      if (npts != 0x16b2) goto LAB_00119f04;
      memcpy(local_30.
             super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>.
             _M_impl.super__Vector_impl_data._M_start,
             &LebedevLaikovGrids::lebedev_laikov_5810<double>::points,0x220b0);
      __n = 0xb590;
      __src = (array<double,_26UL> *)&LebedevLaikovGrids::lebedev_laikov_5810<double>::weights;
    }
LAB_00119eff:
    memcpy(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start,__src,__n);
  }
LAB_00119f04:
  sVar2 = 0;
  do {
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[sVar2] =
         local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[sVar2] * 12.566370614359172;
    sVar2 = sVar2 + 1;
  } while (npts != sVar2);
LAB_00119f28:
  std::
  _Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
  ::
  _Tuple_impl<std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>&,std::vector<double,std::allocator<double>>&,void>
            ((_Tuple_impl<0ul,std::vector<std::array<double,3ul>,std::allocator<std::array<double,3ul>>>,std::vector<double,std::allocator<double>>>
              *)__return_storage_ptr__,&local_30,&local_48);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_30.
      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.
                    super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_30.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.
                          super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

inline static std::tuple<point_container,weight_container>
    generate( size_t npts ) {

    point_container  points( npts );
    weight_container weights( npts );

    using namespace LebedevLaikovGrids;

    if( npts == 6 ) 
      detail::copy_grid<lebedev_laikov_6<RealType>>( points, weights );
    else if( npts == 14 ) 
      detail::copy_grid<lebedev_laikov_14<RealType>>( points, weights );
    else if( npts == 26 ) 
      detail::copy_grid<lebedev_laikov_26<RealType>>( points, weights );
    else if( npts == 38 ) 
      detail::copy_grid<lebedev_laikov_38<RealType>>( points, weights );
    else if( npts == 50 ) 
      detail::copy_grid<lebedev_laikov_50<RealType>>( points, weights );
    else if( npts == 74 ) 
      detail::copy_grid<lebedev_laikov_74<RealType>>( points, weights );
    else if( npts == 86 ) 
      detail::copy_grid<lebedev_laikov_86<RealType>>( points, weights );
    else if( npts == 110 ) 
      detail::copy_grid<lebedev_laikov_110<RealType>>( points, weights );
    else if( npts == 146 ) 
      detail::copy_grid<lebedev_laikov_146<RealType>>( points, weights );
    else if( npts == 170 ) 
      detail::copy_grid<lebedev_laikov_170<RealType>>( points, weights );
    else if( npts == 194 ) 
      detail::copy_grid<lebedev_laikov_194<RealType>>( points, weights );
    else if( npts == 230 ) 
      detail::copy_grid<lebedev_laikov_230<RealType>>( points, weights );
    else if( npts == 266 ) 
      detail::copy_grid<lebedev_laikov_266<RealType>>( points, weights );
    else if( npts == 302 ) 
      detail::copy_grid<lebedev_laikov_302<RealType>>( points, weights );
    else if( npts == 350 ) 
      detail::copy_grid<lebedev_laikov_350<RealType>>( points, weights );
    else if( npts == 434 ) 
      detail::copy_grid<lebedev_laikov_434<RealType>>( points, weights );
    else if( npts == 590 ) 
      detail::copy_grid<lebedev_laikov_590<RealType>>( points, weights );
    else if( npts == 770 ) 
      detail::copy_grid<lebedev_laikov_770<RealType>>( points, weights );
    else if( npts == 974 ) 
      detail::copy_grid<lebedev_laikov_974<RealType>>( points, weights );
    else if( npts == 1202 ) 
      detail::copy_grid<lebedev_laikov_1202<RealType>>( points, weights );
    else if( npts == 1454 ) 
      detail::copy_grid<lebedev_laikov_1454<RealType>>( points, weights );
    else if( npts == 1730 ) 
      detail::copy_grid<lebedev_laikov_1730<RealType>>( points, weights );
    else if( npts == 2030 ) 
      detail::copy_grid<lebedev_laikov_2030<RealType>>( points, weights );
    else if( npts == 2354 ) 
      detail::copy_grid<lebedev_laikov_2354<RealType>>( points, weights );
    else if( npts == 2702 ) 
      detail::copy_grid<lebedev_laikov_2702<RealType>>( points, weights );
    else if( npts == 3074 ) 
      detail::copy_grid<lebedev_laikov_3074<RealType>>( points, weights );
    else if( npts == 3470 ) 
      detail::copy_grid<lebedev_laikov_3470<RealType>>( points, weights );
    else if( npts == 3890 ) 
      detail::copy_grid<lebedev_laikov_3890<RealType>>( points, weights );
    else if( npts == 4334 ) 
      detail::copy_grid<lebedev_laikov_4334<RealType>>( points, weights );
    else if( npts == 4802 ) 
      detail::copy_grid<lebedev_laikov_4802<RealType>>( points, weights );
    else if( npts == 5810 ) 
      detail::copy_grid<lebedev_laikov_5810<RealType>>( points, weights );

    // Pretabulated weights are missing 4 pi
    for(auto i=0; i < npts; i++)
      weights[i] *= 4.0*M_PI;
        
    return std::make_tuple( points, weights );

  }